

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O1

void __thiscall
DIS::LinearObjectStatePdu::marshal(LinearObjectStatePdu *this,DataStream *dataStream)

{
  double *pdVar1;
  pointer pLVar2;
  ulong uVar3;
  long lVar4;
  LinearSegmentParameter x;
  LinearSegmentParameter local_98;
  
  SyntheticEnvironmentFamilyPdu::marshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::marshal(&this->_objectID,dataStream);
  EntityID::marshal(&this->_referencedObjectID,dataStream);
  DataStream::operator<<(dataStream,this->_updateNumber);
  DataStream::operator<<(dataStream,this->_forceID);
  DataStream::operator<<
            (dataStream,
             (char)((uint)(*(int *)&(this->_linearSegmentParameters).
                                    super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->_linearSegmentParameters).
                                   super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x3b);
  SimulationAddress::marshal(&this->_requesterID,dataStream);
  SimulationAddress::marshal(&this->_receivingID,dataStream);
  ObjectType::marshal(&this->_objectType,dataStream);
  pLVar2 = (this->_linearSegmentParameters).
           super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_linearSegmentParameters).
      super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>.
      _M_impl.super__Vector_impl_data._M_finish != pLVar2) {
    lVar4 = 0x58;
    uVar3 = 0;
    do {
      local_98._vptr_LinearSegmentParameter = (_func_int **)&PTR__LinearSegmentParameter_001a0658;
      local_98._segmentNumber = *(uchar *)((long)(&pLVar2->_segmentAppearance + -6) + lVar4);
      local_98._segmentAppearance._vptr_SixByteChunk = (_func_int **)&PTR__SixByteChunk_001a1300;
      local_98._segmentAppearance._otherParameters._4_2_ =
           *(undefined2 *)((pLVar2->_segmentAppearance)._otherParameters + lVar4 + -0x54);
      local_98._segmentAppearance._otherParameters._0_4_ =
           *(undefined4 *)((long)(&pLVar2->_segmentAppearance + -5) + lVar4);
      local_98._location._vptr_Vector3Double = (_func_int **)&PTR__Vector3Double_001a1778;
      local_98._location._z = *(double *)((long)(&pLVar2->_segmentAppearance + -3) + lVar4);
      pdVar1 = (double *)((long)(&pLVar2->_segmentAppearance + -4) + lVar4);
      local_98._location._x = *pdVar1;
      local_98._location._y = pdVar1[1];
      local_98._orientation._vptr_Orientation = (_func_int **)&PTR__Orientation_001a0a40;
      local_98._orientation._phi =
           *(float *)((pLVar2->_segmentAppearance)._otherParameters + lVar4 + -0x20);
      local_98._orientation._8_8_ =
           *(undefined8 *)((long)(&pLVar2->_segmentAppearance + -2) + lVar4);
      local_98._pad1 = *(uint *)((pLVar2->_segmentAppearance)._otherParameters + lVar4 + -0x10);
      local_98._88_8_ =
           *(undefined8 *)
            ((long)&((LinearSegmentParameter *)
                    (&((LinearSegmentParameter *)
                      (&((LinearSegmentParameter *)(&pLVar2->_segmentAppearance + -1))->
                        _segmentAppearance + -1))->_segmentAppearance + -1))->_segmentAppearance +
            lVar4 + 0xfffffffffffffff0U);
      LinearSegmentParameter::marshal(&local_98,dataStream);
      LinearSegmentParameter::~LinearSegmentParameter(&local_98);
      uVar3 = uVar3 + 1;
      pLVar2 = (this->_linearSegmentParameters).
               super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x68;
    } while (uVar3 < (ulong)(((long)(this->_linearSegmentParameters).
                                    super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar2 >> 3)
                            * 0x4ec4ec4ec4ec4ec5));
  }
  return;
}

Assistant:

void LinearObjectStatePdu::marshal(DataStream& dataStream) const
{
    SyntheticEnvironmentFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _objectID.marshal(dataStream);
    _referencedObjectID.marshal(dataStream);
    dataStream << _updateNumber;
    dataStream << _forceID;
    dataStream << ( unsigned char )_linearSegmentParameters.size();
    _requesterID.marshal(dataStream);
    _receivingID.marshal(dataStream);
    _objectType.marshal(dataStream);

     for(size_t idx = 0; idx < _linearSegmentParameters.size(); idx++)
     {
        LinearSegmentParameter x = _linearSegmentParameters[idx];
        x.marshal(dataStream);
     }

}